

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTStateSparsity
          (OptimalControlProblem *this,SparsityStructure *stateSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  byte bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Self __tmp;
  ostringstream errorMsg;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  p_Var4 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = 1;
  do {
    pOVar1 = this->m_pimpl;
    if ((bVar2 & 1) == 0) {
      if ((pOVar1->dynamicalSystem).
          super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,
                        "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown."
                       );
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costsSecondPartialDerivativeWRTStateSparsity",
                   local_1c8[0]);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        bVar3 = false;
      }
      else {
        SparsityStructure::clear(&pOVar1->costsStateHessianSparsity);
        pOVar1 = this->m_pimpl;
        numberOfRows = DynamicalSystem::stateSpaceSize
                                 ((pOVar1->dynamicalSystem).
                                  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        numberOfColumns =
             DynamicalSystem::stateSpaceSize
                       ((this->m_pimpl->dynamicalSystem).
                        super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        SparsityStructure::addDenseBlock
                  (&pOVar1->costsStateHessianSparsity,0,0,numberOfRows,numberOfColumns);
LAB_00180adb:
        SparsityStructure::operator=(stateSparsity,&this->m_pimpl->costsStateHessianSparsity);
        bVar3 = true;
      }
      return bVar3;
    }
    if ((_Rb_tree_header *)p_Var4 == &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header) {
      SparsityStructure::clear(&pOVar1->costsStateHessianSparsity);
      pOVar1 = this->m_pimpl;
      for (p_Var4 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        SparsityStructure::merge
                  (&this->m_pimpl->costsStateHessianSparsity,(SparsityStructure *)&p_Var4[9]._M_left
                  );
      }
      goto LAB_00180adb;
    }
    bVar2 = (**(code **)(**(long **)(p_Var4 + 2) + 0x40))();
    *(byte *)&p_Var4[0x13]._M_parent = bVar2;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            bool allHaveSparsity = true;

            auto cost = m_pimpl->costs.begin();

            while (allHaveSparsity && cost != m_pimpl->costs.end()) {
                cost->second.hasStateHessianSparsity =
                    cost->second.cost->costSecondPartialDerivativeWRTStateSparsity(cost->second.stateHessianSparsity);
                allHaveSparsity &= cost->second.hasStateHessianSparsity;
                cost++;
            }

            if (allHaveSparsity) {
                m_pimpl->costsStateHessianSparsity.clear();

                for (auto& costPtr : m_pimpl->costs) {
                    m_pimpl->costsStateHessianSparsity.merge(costPtr.second.stateHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->costsStateHessianSparsity.clear();
                    m_pimpl->costsStateHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->stateSpaceSize(), m_pimpl->dynamicalSystem->stateSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown.";
                    reportError("OptimalControlProblem", "costsSecondPartialDerivativeWRTStateSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            stateSparsity = m_pimpl->costsStateHessianSparsity;
            return true;
        }